

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Action::Action(Action *this,ActionType type,Location *loc)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  this->_vptr_Action = (_func_int **)&PTR__Action_002414a0;
  pcVar1 = (loc->filename)._M_str;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->loc).filename._M_len = (loc->filename)._M_len;
  (this->loc).filename._M_str = pcVar1;
  (this->loc).field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = uVar3;
  Var::Var(&this->module_var);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->type_ = type;
  return;
}

Assistant:

explicit Action(ActionType type, const Location& loc = Location())
      : loc(loc), type_(type) {}